

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simulator.h
# Opt level: O2

void __thiscall Simulator::push_real_array(Simulator *this,PCode *code)

{
  bool bVar1;
  Symbol *pSVar2;
  unsigned_long __n;
  const_reference pvVar3;
  string *str;
  Symbol offset;
  StackSymbol local_e8;
  Symbol symbol;
  
  pSVar2 = ScopeTree::resolve(&this->tree_,&code->first_);
  Symbol::Symbol(&symbol,pSVar2);
  str = &code->second_;
  bVar1 = Recognition::is_integer(str);
  if (bVar1) {
    __n = std::__cxx11::stoul(str,(size_t *)0x0,10);
    pvVar3 = std::vector<double,_std::allocator<double>_>::at(&symbol.value_.real_array,__n);
    offset.name_._M_dataplus._M_p._0_4_ = 2;
    offset.type_ = kNone;
    offset.ret_type_ = kNone;
    offset.name_.field_2._M_allocated_capacity = 0;
    offset.name_.field_2._8_8_ = 0;
    offset.value_.int_value = 0;
    offset.value_._28_4_ = 0;
    offset.value_.args.super__Vector_base<Symbol,_std::allocator<Symbol>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    offset.value_.args.super__Vector_base<Symbol,_std::allocator<Symbol>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    offset.value_.args.super__Vector_base<Symbol,_std::allocator<Symbol>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)*pvVar3;
    std::deque<StackSymbol,_std::allocator<StackSymbol>_>::emplace_back<StackSymbol>
              (&this->stack_,(StackSymbol *)&offset);
    StackSymbol::UnionValue::~UnionValue(&offset.name_._M_string_length);
  }
  else {
    pSVar2 = ScopeTree::resolve(&this->tree_,str);
    Symbol::Symbol(&offset,pSVar2);
    pvVar3 = std::vector<double,_std::allocator<double>_>::at
                       (&symbol.value_.real_array,(long)offset.value_.int_value);
    local_e8.type_ = kReal;
    local_e8.value_.int_array.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_e8.value_.int_array.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_e8.value_.int_array.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_e8.value_.real_array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_e8.value_.real_array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_e8.value_.real_array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_e8.value_.real_value = *pvVar3;
    std::deque<StackSymbol,_std::allocator<StackSymbol>_>::emplace_back<StackSymbol>
              (&this->stack_,&local_e8);
    StackSymbol::UnionValue::~UnionValue(&local_e8.value_);
    Symbol::~Symbol(&offset);
  }
  this->eip_ = this->eip_ + 1;
  Symbol::~Symbol(&symbol);
  return;
}

Assistant:

void Simulator::push_real_array(const PCode &code) {
    Symbol symbol = tree_.resolve(code.first());
    if (Recognition::is_integer(code.second())) {
        stack_.push_back(StackSymbol(symbol.real_array().at(std::stoul(code.second()))));
    } else {
        Symbol offset = tree_.resolve(code.second());
        stack_.push_back(StackSymbol(symbol.real_array().at((unsigned long)offset.int_value())));
    }
    inc_eip();
}